

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_setup_frame_buf_refs(AV1_COMMON *cm)

{
  long in_RDI;
  RefCntBuffer *buf;
  MV_REFERENCE_FRAME ref_frame;
  RefCntBuffer *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  char cVar1;
  
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 4) = *(undefined4 *)(in_RDI + 4);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x24) = *(undefined4 *)(in_RDI + 8);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x44) = *(undefined4 *)(in_RDI + 0xc);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x58d4) = 0xffffffff;
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x58d8) = 0xffffffff;
  for (cVar1 = '\x01'; cVar1 < '\b'; cVar1 = cVar1 + '\x01') {
    in_stack_ffffffffffffffe8 =
         get_ref_frame_buf((AV1_COMMON *)CONCAT17(cVar1,in_stack_fffffffffffffff0),
                           (MV_REFERENCE_FRAME)((ulong)in_stack_ffffffffffffffe8 >> 0x38));
    if (in_stack_ffffffffffffffe8 != (RefCntBuffer *)0x0) {
      *(uint *)(*(long *)(in_RDI + 0xe8) + 8 + (long)(cVar1 + -1) * 4) =
           in_stack_ffffffffffffffe8->order_hint;
      *(uint *)(*(long *)(in_RDI + 0xe8) + 0x28 + (long)(cVar1 + -1) * 4) =
           in_stack_ffffffffffffffe8->display_order_hint;
    }
  }
  return;
}

Assistant:

void av1_setup_frame_buf_refs(AV1_COMMON *cm) {
  cm->cur_frame->order_hint = cm->current_frame.order_hint;
  cm->cur_frame->display_order_hint = cm->current_frame.display_order_hint;
  cm->cur_frame->pyramid_level = cm->current_frame.pyramid_level;
  cm->cur_frame->filter_level[0] = -1;
  cm->cur_frame->filter_level[1] = -1;
  MV_REFERENCE_FRAME ref_frame;
  for (ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ++ref_frame) {
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    if (buf != NULL) {
      cm->cur_frame->ref_order_hints[ref_frame - LAST_FRAME] = buf->order_hint;
      cm->cur_frame->ref_display_order_hint[ref_frame - LAST_FRAME] =
          buf->display_order_hint;
    }
  }
}